

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

void __thiscall ELFIO::elfio::clean(elfio *this)

{
  bool bVar1;
  reference ppsVar2;
  reference ppsVar3;
  long in_RDI;
  const_iterator it1;
  const_iterator it;
  vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_> *in_stack_ffffffffffffff98;
  section *in_stack_ffffffffffffffa0;
  __normal_iterator<ELFIO::segment_*const_*,_std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>_>
  local_30;
  section **local_28;
  section **local_20;
  section **local_18;
  __normal_iterator<ELFIO::section_*const_*,_std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>_>
  local_10 [2];
  
  if (*(long **)(in_RDI + 0x10) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x10) + 8))();
  }
  *(undefined8 *)(in_RDI + 0x10) = 0;
  __gnu_cxx::
  __normal_iterator<ELFIO::section_*const_*,_std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>_>
  ::__normal_iterator(local_10);
  local_20 = (section **)
             std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>::begin
                       (in_stack_ffffffffffffff98);
  __gnu_cxx::
  __normal_iterator<ELFIO::section*const*,std::vector<ELFIO::section*,std::allocator<ELFIO::section*>>>
  ::__normal_iterator<ELFIO::section**>
            ((__normal_iterator<ELFIO::section_*const_*,_std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>_>
              *)in_stack_ffffffffffffffa0,
             (__normal_iterator<ELFIO::section_**,_std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>_>
              *)in_stack_ffffffffffffff98);
  local_10[0]._M_current = local_18;
  while( true ) {
    local_28 = (section **)
               std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>::end
                         (in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<ELFIO::section_*const_*,_std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<ELFIO::section_**,_std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    ppsVar2 = __gnu_cxx::
              __normal_iterator<ELFIO::section_*const_*,_std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>_>
              ::operator*(local_10);
    in_stack_ffffffffffffffa0 = *ppsVar2;
    if (in_stack_ffffffffffffffa0 != (section *)0x0) {
      (*in_stack_ffffffffffffffa0->_vptr_section[1])();
    }
    __gnu_cxx::
    __normal_iterator<ELFIO::section_*const_*,_std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>_>
    ::operator++(local_10);
  }
  std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>::clear
            ((vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_> *)0x106707);
  __gnu_cxx::
  __normal_iterator<ELFIO::segment_*const_*,_std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>_>
  ::__normal_iterator(&local_30);
  std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::begin
            ((vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)
             in_stack_ffffffffffffff98);
  __gnu_cxx::
  __normal_iterator<ELFIO::segment*const*,std::vector<ELFIO::segment*,std::allocator<ELFIO::segment*>>>
  ::__normal_iterator<ELFIO::segment**>
            ((__normal_iterator<ELFIO::segment_*const_*,_std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>_>
              *)in_stack_ffffffffffffffa0,
             (__normal_iterator<ELFIO::segment_**,_std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>_>
              *)in_stack_ffffffffffffff98);
  while( true ) {
    std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::end
              ((vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)
               in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<ELFIO::segment_*const_*,_std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<ELFIO::segment_**,_std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    ppsVar3 = __gnu_cxx::
              __normal_iterator<ELFIO::segment_*const_*,_std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>_>
              ::operator*(&local_30);
    in_stack_ffffffffffffff98 =
         (vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_> *)*ppsVar3;
    if (in_stack_ffffffffffffff98 !=
        (vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_> *)0x0) {
      (*(code *)(in_stack_ffffffffffffff98->
                super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>)._M_impl.
                super__Vector_impl_data._M_start[1])();
    }
    __gnu_cxx::
    __normal_iterator<ELFIO::segment_*const_*,_std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>_>
    ::operator++(&local_30);
  }
  std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::clear
            ((vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)0x1067a2);
  return;
}

Assistant:

void clean()
    {
        delete header;
        header = 0;

        std::vector<section*>::const_iterator it;
        for ( it = sections_.begin(); it != sections_.end(); ++it ) {
            delete *it;
        }
        sections_.clear();

        std::vector<segment*>::const_iterator it1;
        for ( it1 = segments_.begin(); it1 != segments_.end(); ++it1 ) {
            delete *it1;
        }
        segments_.clear();
    }